

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O0

Flow * __thiscall
wasm::ExpressionRunner<wasm::CExpressionRunner>::visitThrow
          (Flow *__return_storage_ptr__,ExpressionRunner<wasm::CExpressionRunner> *this,Throw *curr)

{
  bool bVar1;
  Literal local_88;
  undefined1 local_59;
  undefined1 local_58 [8];
  Literals arguments;
  Throw *curr_local;
  ExpressionRunner<wasm::CExpressionRunner> *this_local;
  Flow *flow;
  
  arguments.super_SmallVector<wasm::Literal,_1UL>.flexible.
  super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)curr;
  Literals::Literals((Literals *)local_58);
  local_59 = 0;
  generateArguments(__return_storage_ptr__,this,
                    (ExpressionList *)
                    &arguments.super_SmallVector<wasm::Literal,_1UL>.flexible.
                     super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage[1].field_0.func.super_IString.str.
                     _M_str,(Literals *)local_58);
  bVar1 = Flow::breaking(__return_storage_ptr__);
  if (bVar1) {
    local_59 = 1;
    Literals::~Literals((Literals *)local_58);
    return __return_storage_ptr__;
  }
  makeExnData(&local_88,this,
              (IString)*(IString *)
                        &(arguments.super_SmallVector<wasm::Literal,_1UL>.flexible.
                          super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage)->type,(Literals *)local_58);
  (*this->_vptr_ExpressionRunner[4])(this,&local_88);
  WasmException::~WasmException((WasmException *)&local_88);
  handle_unreachable("throw",
                     "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-interpreter.h"
                     ,0x623);
}

Assistant:

Flow visitThrow(Throw* curr) {
    NOTE_ENTER("Throw");
    Literals arguments;
    Flow flow = generateArguments(curr->operands, arguments);
    if (flow.breaking()) {
      return flow;
    }
    NOTE_EVAL1(curr->tag);
    throwException(WasmException{makeExnData(curr->tag, arguments)});
    WASM_UNREACHABLE("throw");
  }